

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O2

void PushInterval(CostManager *manager,int64_t distance_cost,int position,int len)

{
  int end;
  int end_00;
  CostCacheInterval *pCVar1;
  CostInterval *pCVar2;
  int64_t *piVar3;
  CostCacheInterval *pCVar4;
  int start_new;
  CostInterval *interval_in;
  ulong uVar5;
  uint16_t uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  
  if (len < 10) {
    piVar3 = manager->cost_cache_;
    uVar6 = 1;
    for (lVar7 = (long)position; lVar7 < len + position; lVar7 = lVar7 + 1) {
      if (*piVar3 + distance_cost < manager->costs_[lVar7]) {
        manager->costs_[lVar7] = *piVar3 + distance_cost;
        manager->dist_array_[lVar7] = uVar6;
      }
      uVar6 = uVar6 + 1;
      piVar3 = piVar3 + 1;
    }
  }
  else {
    pCVar1 = manager->cache_intervals_;
    interval_in = manager->head_;
    for (uVar5 = 0; uVar5 < manager->cache_intervals_size_; uVar5 = uVar5 + 1) {
      iVar9 = pCVar1[uVar5].start_;
      if (len <= iVar9) {
        return;
      }
      pCVar4 = pCVar1 + uVar5;
      iVar8 = pCVar4->end_;
      if (len <= iVar8) {
        iVar8 = len;
      }
      iVar8 = iVar8 + position;
      lVar7 = pCVar4->cost_ + distance_cost;
      pCVar2 = interval_in;
      iVar9 = iVar9 + position;
      do {
        while( true ) {
          do {
            interval_in = pCVar2;
            if (interval_in == (CostInterval *)0x0) {
              interval_in = (CostInterval *)0x0;
              goto LAB_0013d203;
            }
            end = interval_in->start_;
            if (iVar8 <= end) goto LAB_0013d203;
            pCVar2 = interval_in->next_;
            end_00 = interval_in->end_;
          } while (end_00 <= iVar9);
          if (interval_in->cost_ <= lVar7) break;
          if (end < iVar9) {
            if (iVar8 < end_00) {
              interval_in->end_ = iVar9;
              InsertInterval(manager,interval_in,interval_in->cost_,interval_in->index_,iVar8,end_00
                            );
              interval_in = interval_in->next_;
              goto LAB_0013d203;
            }
            interval_in->end_ = iVar9;
          }
          else {
            if (iVar8 < end_00) {
              interval_in->start_ = iVar8;
              goto LAB_0013d203;
            }
            PopInterval(manager,interval_in);
          }
        }
        InsertInterval(manager,interval_in,lVar7,position,iVar9,end);
        iVar9 = end_00;
      } while (end_00 < iVar8);
LAB_0013d203:
      InsertInterval(manager,interval_in,lVar7,position,iVar9,iVar8);
    }
  }
  return;
}

Assistant:

static WEBP_INLINE void PushInterval(CostManager* const manager,
                                     int64_t distance_cost, int position,
                                     int len) {
  size_t i;
  CostInterval* interval = manager->head_;
  CostInterval* interval_next;
  const CostCacheInterval* const cost_cache_intervals =
      manager->cache_intervals_;
  // If the interval is small enough, no need to deal with the heavy
  // interval logic, just serialize it right away. This constant is empirical.
  const int kSkipDistance = 10;

  if (len < kSkipDistance) {
    int j;
    for (j = position; j < position + len; ++j) {
      const int k = j - position;
      int64_t cost_tmp;
      assert(k >= 0 && k < MAX_LENGTH);
      cost_tmp = distance_cost + manager->cost_cache_[k];

      if (manager->costs_[j] > cost_tmp) {
        manager->costs_[j] = cost_tmp;
        manager->dist_array_[j] = k + 1;
      }
    }
    return;
  }

  for (i = 0; i < manager->cache_intervals_size_ &&
              cost_cache_intervals[i].start_ < len;
       ++i) {
    // Define the intersection of the ith interval with the new one.
    int start = position + cost_cache_intervals[i].start_;
    const int end = position + (cost_cache_intervals[i].end_ > len
                                 ? len
                                 : cost_cache_intervals[i].end_);
    const int64_t cost = distance_cost + cost_cache_intervals[i].cost_;

    for (; interval != NULL && interval->start_ < end;
         interval = interval_next) {
      interval_next = interval->next_;

      // Make sure we have some overlap
      if (start >= interval->end_) continue;

      if (cost >= interval->cost_) {
        // When intervals are represented, the lower, the better.
        // [**********************************************************[
        // start                                                    end
        //                   [----------------------------------[
        //                   interval->start_       interval->end_
        // If we are worse than what we already have, add whatever we have so
        // far up to interval.
        const int start_new = interval->end_;
        InsertInterval(manager, interval, cost, position, start,
                       interval->start_);
        start = start_new;
        if (start >= end) break;
        continue;
      }

      if (start <= interval->start_) {
        if (interval->end_ <= end) {
          //                   [----------------------------------[
          //                   interval->start_       interval->end_
          // [**************************************************************[
          // start                                                        end
          // We can safely remove the old interval as it is fully included.
          PopInterval(manager, interval);
        } else {
          //              [------------------------------------[
          //              interval->start_        interval->end_
          // [*****************************[
          // start                       end
          interval->start_ = end;
          break;
        }
      } else {
        if (end < interval->end_) {
          // [--------------------------------------------------------------[
          // interval->start_                                  interval->end_
          //                     [*****************************[
          //                     start                       end
          // We have to split the old interval as it fully contains the new one.
          const int end_original = interval->end_;
          interval->end_ = start;
          InsertInterval(manager, interval, interval->cost_, interval->index_,
                         end, end_original);
          interval = interval->next_;
          break;
        } else {
          // [------------------------------------[
          // interval->start_        interval->end_
          //                     [*****************************[
          //                     start                       end
          interval->end_ = start;
        }
      }
    }
    // Insert the remaining interval from start to end.
    InsertInterval(manager, interval, cost, position, start, end);
  }
}